

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.hpp
# Opt level: O0

InterfaceBlockInfo *
glu::getProgramInterfaceBlockInfo
          (InterfaceBlockInfo *__return_storage_ptr__,Functions *gl,deUint32 program,
          deUint32 programInterface,deUint32 index)

{
  deUint32 index_local;
  deUint32 programInterface_local;
  deUint32 program_local;
  Functions *gl_local;
  InterfaceBlockInfo *info;
  
  InterfaceBlockInfo::InterfaceBlockInfo(__return_storage_ptr__);
  getProgramInterfaceBlockInfo(gl,program,programInterface,index,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline InterfaceBlockInfo getProgramInterfaceBlockInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index)
{
	InterfaceBlockInfo info;
	getProgramInterfaceBlockInfo(gl, program, programInterface, index, info);
	return info;
}